

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

void __thiscall glslang::HlslParseContext::trackLinkage(HlslParseContext *this,TSymbol *symbol)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  undefined4 extraout_var_00;
  mapped_type *ppTVar3;
  TBuiltInVariable biType;
  key_type local_1c;
  
  iVar1 = (*symbol->_vptr_TSymbol[0xc])(symbol);
  lVar2 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x58))
                    ((long *)CONCAT44(extraout_var,iVar1));
  local_1c = *(uint *)(lVar2 + 8) >> 7 & 0x1ff;
  if (local_1c != EbvNone) {
    iVar1 = (**symbol->_vptr_TSymbol)(symbol);
    ppTVar3 = std::
              map<glslang::TBuiltInVariable,_glslang::TSymbol_*,_std::less<glslang::TBuiltInVariable>,_glslang::pool_allocator<std::pair<const_glslang::TBuiltInVariable,_glslang::TSymbol_*>_>_>
              ::operator[](&(this->builtInTessLinkageSymbols).
                            super_map<glslang::TBuiltInVariable,_glslang::TSymbol_*,_std::less<glslang::TBuiltInVariable>,_glslang::pool_allocator<std::pair<const_glslang::TBuiltInVariable,_glslang::TSymbol_*>_>_>
                           ,&local_1c);
    *ppTVar3 = (mapped_type)CONCAT44(extraout_var_00,iVar1);
  }
  TParseContextBase::trackLinkage(&this->super_TParseContextBase,symbol);
  return;
}

Assistant:

void HlslParseContext::trackLinkage(TSymbol& symbol)
{
    TBuiltInVariable biType = symbol.getType().getQualifier().builtIn;

    if (biType != EbvNone)
        builtInTessLinkageSymbols[biType] = symbol.clone();

    TParseContextBase::trackLinkage(symbol);
}